

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

bool __thiscall
iDynTree::AttitudeQuaternionEKF::updateFilterWithMeasurements
          (AttitudeQuaternionEKF *this,LinearAccelerometerMeasurements *linAccMeas,
          GyroscopeMeasurements *gyroMeas,MagnetometerMeasurements *magMeas)

{
  double dVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  string local_d0;
  Vector3 linAccMeasUnitVector;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> m_B_modified;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> m_A;
  Vector3 magMeasUnitVector;
  Vector3 modified_mag_meas_in_body_frame;
  Vector3 mag_meas_in_inertial_frame;
  
  sVar3 = iDynTree::VectorDynSize::size();
  if (sVar3 != this->m_output_size) {
    iDynTree::VectorDynSize::resize((ulong)&this->m_y);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"linear acceleration",(allocator<char> *)&linAccMeasUnitVector);
  bVar2 = checkValidMeasurement(linAccMeas,&local_d0,true);
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"gyroscope",(allocator<char> *)&linAccMeasUnitVector);
    bVar2 = checkValidMeasurement(gyroMeas,&local_d0,false);
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"magnetometer",(allocator<char> *)&linAccMeasUnitVector);
      bVar2 = checkValidMeasurement(magMeas,&local_d0,true);
      std::__cxx11::string::~string((string *)&local_d0);
      if (bVar2) {
        bVar2 = getUnitVector(linAccMeas,&linAccMeasUnitVector);
        if (bVar2) {
          (this->m_Acc_y).m_data[2] = linAccMeasUnitVector.m_data[2];
          (this->m_Acc_y).m_data[0] = linAccMeasUnitVector.m_data[0];
          (this->m_Acc_y).m_data[1] = linAccMeasUnitVector.m_data[1];
          dVar1 = gyroMeas->m_data[1];
          (this->m_Omega_y).m_data[0] = gyroMeas->m_data[0];
          (this->m_Omega_y).m_data[1] = dVar1;
          (this->m_Omega_y).m_data[2] = gyroMeas->m_data[2];
          bVar2 = getUnitVector(magMeas,&magMeasUnitVector);
          if (bVar2) {
            m_A._0_8_ = &mag_meas_in_inertial_frame;
            m_B_modified._0_8_ = &modified_mag_meas_in_body_frame;
            local_d0._M_dataplus._M_p = (pointer)&this->m_orientationInSO3;
            local_d0.field_2._M_allocated_capacity = (size_type)&magMeasUnitVector;
            Eigen::internal::
            call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,0>>
                      (&m_A,(Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             *)&local_d0);
            *(undefined8 *)(m_A._0_8_ + 0x10) = 0;
            local_d0.field_2._M_allocated_capacity = m_A._0_8_;
            local_d0.field_2._8_2_ = m_A._8_2_;
            local_d0._M_dataplus._M_p = (pointer)&this->m_orientationInSO3;
            Eigen::internal::
            call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,0>>
                      (&m_B_modified,
                       (Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)&local_d0);
            dVar1 = atan2(-*(double *)(m_B_modified._0_8_ + 8),*(double *)m_B_modified._0_8_);
            this->m_Mag_y = dVar1;
            bVar2 = callEkfUpdate(this);
            return bVar2;
          }
          pcVar4 = "Cannot retrieve unit vector from magnetometer measuremnts.";
        }
        else {
          pcVar4 = "Cannot retrieve unit vector from linear acceleration measuremnts.";
        }
        iDynTree::reportError("AttitudeQuaternionEKF","updateFilterWithMeasurements",pcVar4);
      }
    }
  }
  return false;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::updateFilterWithMeasurements(const iDynTree::LinearAccelerometerMeasurements& linAccMeas, const iDynTree::GyroscopeMeasurements& gyroMeas, const iDynTree::MagnetometerMeasurements& magMeas)
{
    if (m_y.size() != m_output_size)
    {
        m_y.resize(m_output_size);
    }

    if (!checkValidMeasurement(linAccMeas, "linear acceleration", true)) { return false; }
    if (!checkValidMeasurement(gyroMeas, "gyroscope", false)) { return false; }
    if (!checkValidMeasurement(magMeas, "magnetometer", true)) { return false; }

    iDynTree::Vector3 linAccMeasUnitVector;
    if (!getUnitVector(linAccMeas, linAccMeasUnitVector))
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "updateFilterWithMeasurements", "Cannot retrieve unit vector from linear acceleration measuremnts.");
        return false;
    }

    m_Acc_y = linAccMeasUnitVector;
    m_Omega_y = gyroMeas;

    // compute yaw angle from magnetometer measurements by limiting the vertical influence of magentometer
    // to do this first rotate the measurement to inertial frame, set z-component to zero.
    // convert back to body frame and compute the yaw using atan2(y, x)
    iDynTree::Vector3 mag_meas_in_inertial_frame;
    iDynTree::Vector3 modified_mag_meas_in_body_frame;
    iDynTree::Vector3 magMeasUnitVector;
    if (!getUnitVector(magMeas, magMeasUnitVector))
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "updateFilterWithMeasurements", "Cannot retrieve unit vector from magnetometer measuremnts.");
        return false;
    }

    using iDynTree::toEigen;
    auto m_A(toEigen(mag_meas_in_inertial_frame));
    auto m_B_modified(toEigen(modified_mag_meas_in_body_frame));
    auto m_yB(toEigen(magMeasUnitVector));
    auto A_R_B(toEigen(m_orientationInSO3));

    m_A = A_R_B * m_yB;
    m_A(2) = 0; // to limit the vertical influence of magnetometer {^A}m_z = 0
    m_B_modified = A_R_B.transpose()* m_A; // rotate vector back to body frame
    m_Mag_y = std::atan2(-m_B_modified(1), m_B_modified(0));

    // set accelerometer and magnetometer measurement
    if (!callEkfUpdate())
    {
        return false;
    }

    return true;
}